

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void openSwitches(Graph *g,int *ids,int n)

{
  Edge *pEVar1;
  ulong uVar2;
  
  if (0 < n) {
    uVar2 = 0;
    do {
      pEVar1 = Graph::findEdge(g,ids[uVar2]);
      pEVar1->closed = false;
      pEVar1 = Graph::findEdge(g,pEVar1->destiny->id,pEVar1->origin->id);
      pEVar1->closed = false;
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

void openSwitches(Graph *g, int *ids, int n) {
    Edge *a;
    for (int i = 0; i < n; i++) {
        a = g->findEdge(ids[i]);
        a->setSwitch(false);
        a = g->findEdge(a->getDestiny()->getID(), a->getOrigin()->getID());
        a->setSwitch(false);
    }
}